

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

CaseDefinition * __thiscall
vkt::pipeline::anon_unknown_0::makeArrayCompositeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,anon_unknown_0 *this,DataType elemType,int size1,
          int size2)

{
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *__return_storage_ptr___00;
  uint idxEnd;
  CaseDefinition *pCVar1;
  DataType DVar2;
  deUint32 dVar3;
  char *pcVar4;
  ostream *poVar5;
  DataType dataType;
  DataType dataType_00;
  int iVar6;
  ulong uVar7;
  uint idxBegin;
  ulong uVar8;
  int idxEnd_00;
  int iVar9;
  DataType type;
  int size2_local;
  int numCombinations;
  int size1_local;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_4d0;
  DataType local_4c8;
  uint local_4c4;
  CaseDefinition *local_4c0;
  string caseName;
  string accumType;
  string local_470;
  ulong local_450;
  ostream *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string elemTypeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string arraySizeDecl;
  string varName;
  string local_380;
  string local_360;
  string local_340;
  ostringstream arrayCtorExpr;
  string local_318 [368];
  ostringstream globalCode;
  
  uVar7 = (ulong)(uint)size2;
  dataType = (DataType)this;
  size1_local = 3;
  size2_local = elemType;
  local_4c8 = elemType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&varName,"a",(allocator<char> *)&arrayCtorExpr);
  de::toString<int>(&caseName,&size1_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalCode,
                 "[",&caseName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arrayCtorExpr
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalCode,
                 "]");
  DVar2 = local_4c8;
  if ((int)local_4c8 < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&accumType,"",(allocator<char> *)&local_3e0);
  }
  else {
    de::toString<int>(&local_340,&size2_local);
    std::operator+(&local_3e0,"[",&local_340);
    std::operator+(&accumType,&local_3e0,"]");
  }
  std::operator+(&arraySizeDecl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arrayCtorExpr
                 ,&accumType);
  std::__cxx11::string::~string((string *)&accumType);
  if (0 < (int)DVar2) {
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_340);
  }
  local_4c0 = __return_storage_ptr__;
  std::__cxx11::string::~string((string *)&arrayCtorExpr);
  std::__cxx11::string::~string((string *)&globalCode);
  std::__cxx11::string::~string((string *)&caseName);
  iVar9 = size2_local;
  if ((int)DVar2 < 1) {
    iVar9 = 1;
  }
  numCombinations = iVar9 * size1_local;
  uVar8 = (ulong)(uint)numCombinations;
  pcVar4 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elemTypeName,pcVar4,(allocator<char> *)&arrayCtorExpr);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalCode);
  iVar9 = 0;
  local_4c4 = (byte)((byte)(0x777ffbffd >> ((byte)this & 0x3f)) | TYPE_BOOL < dataType) & 1;
  local_450 = uVar8;
  while( true ) {
    iVar6 = (int)uVar7;
    if ((int)uVar8 <= iVar9) break;
    poVar5 = std::operator<<((ostream *)&globalCode,(string *)&elemTypeName);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)&varName);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
    poVar5 = std::operator<<(poVar5,(string *)&arraySizeDecl);
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = std::operator<<(poVar5,(string *)&elemTypeName);
    poVar5 = std::operator<<(poVar5,(string *)&arraySizeDecl);
    local_448 = std::operator<<(poVar5,"(");
    idxEnd_00 = size1_local;
    iVar6 = size2_local;
    local_4d0 = (vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                 *)CONCAT44(local_4d0._4_4_,iVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"sc0",(allocator<char> *)&local_400);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&arrayCtorExpr);
    if (iVar6 < 1) {
      iVar9 = (int)local_4d0;
      uVar7 = (ulong)(uint)idxEnd_00;
      composite_case_internal::generateInitializerListWithSpecConstant
                (&caseName,dataType,SUB41(local_4c4,0),0,idxEnd_00,&local_470,(int)local_4d0);
      std::operator<<((ostream *)&arrayCtorExpr,(string *)&caseName);
      std::__cxx11::string::~string((string *)&caseName);
    }
    else {
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      std::__cxx11::string::_M_construct((ulong)&caseName,'$');
      if (idxEnd_00 < 1) {
        idxEnd_00 = 0;
      }
      idxBegin = 0;
      for (iVar9 = 0; idxEnd_00 != iVar9; iVar9 = iVar9 + 1) {
        if (iVar9 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&accumType,"",&local_4d1);
        }
        else {
          std::operator+(&accumType,",\n",&caseName);
        }
        poVar5 = std::operator<<((ostream *)&arrayCtorExpr,(string *)&accumType);
        pcVar4 = glu::getDataTypeName(dataType);
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,"[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
        std::operator<<(poVar5,"](");
        std::__cxx11::string::~string((string *)&accumType);
        idxEnd = iVar6 + idxBegin;
        uVar7 = (ulong)idxEnd;
        composite_case_internal::generateInitializerListWithSpecConstant
                  (&accumType,dataType,SUB41(local_4c4,0),idxBegin,idxEnd,&local_470,(int)local_4d0)
        ;
        std::operator<<((ostream *)&arrayCtorExpr,(string *)&accumType);
        std::__cxx11::string::~string((string *)&accumType);
        std::operator<<((ostream *)&arrayCtorExpr,")");
        idxBegin = idxEnd;
      }
      std::__cxx11::string::~string((string *)&caseName);
      uVar8 = local_450;
      iVar9 = (int)local_4d0;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&arrayCtorExpr);
    poVar5 = std::operator<<(local_448,(string *)&local_440);
    std::operator<<(poVar5,");\n");
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_470);
    iVar9 = iVar9 + 1;
  }
  DVar2 = glu::getDataTypeScalarType(dataType);
  type = TYPE_DOUBLE_MAT2X3;
  if (DVar2 == TYPE_BOOL) {
    type = TYPE_INVALID;
  }
  pcVar4 = "array_";
  if ((int)local_4c8 < 1) {
    pcVar4 = "";
  }
  std::operator+(&caseName,pcVar4,&elemTypeName);
  dataType_00 = TYPE_INT;
  if (DVar2 != TYPE_BOOL) {
    dataType_00 = DVar2;
  }
  pcVar4 = glu::getDataTypeName(dataType_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&accumType,pcVar4,(allocator<char> *)&arrayCtorExpr);
  std::__cxx11::string::string((string *)local_4c0,(string *)&caseName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"sc0",&local_4d2);
  composite_case_internal::makeSpecConstant
            ((SpecConstant *)&arrayCtorExpr,&local_360,DVar2,type,iVar6);
  __return_storage_ptr___00 = &local_4c0->specConstants;
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            (__return_storage_ptr___00,(SpecConstant *)&arrayCtorExpr);
  local_4d0 = __return_storage_ptr___00;
  dVar3 = composite_case_internal::getDataTypeScalarSizeBytes(dataType);
  pCVar1 = local_4c0;
  local_4c0->ssboSize = (ulong)((int)uVar8 * dVar3);
  std::operator+(&local_400,"    ",&accumType);
  std::operator+(&local_470,&local_400," result[");
  de::toString<int>(&local_380,&numCombinations);
  std::operator+(&local_440,&local_470,&local_380);
  std::operator+(&pCVar1->ssboCode,&local_440,"];\n");
  std::__cxx11::stringbuf::str();
  composite_case_internal::generateShaderChecksumComputationCode
            (&pCVar1->mainCode,dataType,&varName,&accumType,size1_local,size2_local,numCombinations)
  ;
  composite_case_internal::computeExpectedValues(&pCVar1->expectedValues,type,DVar2,numCombinations)
  ;
  pCVar1->requirements = (uint)(DVar2 == TYPE_DOUBLE) << 2;
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&accumType);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalCode);
  std::__cxx11::string::~string((string *)&elemTypeName);
  std::__cxx11::string::~string((string *)&arraySizeDecl);
  std::__cxx11::string::~string((string *)&varName);
  return pCVar1;
}

Assistant:

CaseDefinition makeArrayCompositeCaseDefinition (const glu::DataType elemType, const int size1, const int size2 = 0)
{
	using namespace composite_case_internal;

	DE_ASSERT(size1 > 0);

	const bool        isArrayOfArray  = (size2 > 0);
	const std::string varName		  = "a";
	const std::string arraySizeDecl   = "[" + de::toString(size1) + "]" + (isArrayOfArray ? "[" + de::toString(size2) + "]" : "");
	const int         numCombinations = (isArrayOfArray ? size1 * size2 : size1);
	const std::string elemTypeName    (glu::getDataTypeName(elemType));

	std::ostringstream globalCode;
	{
		// Create several arrays with specialization constant inserted in different positions.
		for (int combNdx = 0; combNdx < numCombinations; ++combNdx)
			globalCode << elemTypeName << " " << varName << combNdx << arraySizeDecl << " = "
					   << elemTypeName << arraySizeDecl << "(" << generateArrayConstructorString(elemType, size1, size2, "sc0", combNdx) << ");\n";
	}

	const glu::DataType scalarType = glu::getDataTypeScalarType(elemType);
	const bool          isBoolData = (scalarType == glu::TYPE_BOOL);
	const int           specValue  = (isBoolData ? 0 : 19);
	const std::string   caseName   = (isArrayOfArray ? "array_" : "") + elemTypeName;
	const std::string   accumType  = (glu::getDataTypeName(isBoolData ? glu::TYPE_INT : scalarType));

	const CaseDefinition def =
	{
		caseName,
		makeVector(makeSpecConstant("sc0", 1u, scalarType, specValue)),
		static_cast<VkDeviceSize>(getDataTypeScalarSizeBytes(elemType) * numCombinations),
		"    " + accumType + " result[" + de::toString(numCombinations) + "];\n",
		globalCode.str(),
		generateShaderChecksumComputationCode(elemType, varName, accumType, size1, size2, numCombinations),
		computeExpectedValues(specValue, scalarType, numCombinations),
		(scalarType == glu::TYPE_DOUBLE ? (FeatureFlags)FEATURE_SHADER_FLOAT_64 : (FeatureFlags)0),
	};
	return def;
}